

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

void __thiscall EefcFlash::eraseAll(EefcFlash *this,uint32_t offset)

{
  FlashEraseError *this_00;
  uint local_28;
  uint32_t pageNum;
  uint32_t offset_local;
  EefcFlash *this_local;
  
  if (offset == 0) {
    waitFSR(this,1);
    writeFCR0(this,'\x05',0);
    if ((this->super_Flash)._planes == 2) {
      waitFSR(this,1);
      writeFCR1(this,'\x05',0);
    }
    waitFSR(this,0x1e);
  }
  else {
    if (offset % ((this->super_Flash)._size << 3) != 0) {
      this_00 = (FlashEraseError *)__cxa_allocate_exception(8);
      FlashEraseError::FlashEraseError(this_00);
      __cxa_throw(this_00,&FlashEraseError::typeinfo,FlashEraseError::~FlashEraseError);
    }
    for (local_28 = offset / (this->super_Flash)._size; local_28 < (this->super_Flash)._pages;
        local_28 = local_28 + 8) {
      if (((this->super_Flash)._planes == 1) || (local_28 < (this->super_Flash)._pages >> 1)) {
        waitFSR(this,1);
        writeFCR0(this,'\a',local_28 | 1);
      }
      else {
        waitFSR(this,1);
        writeFCR1(this,'\a',local_28 % ((this->super_Flash)._pages >> 1) | 1);
      }
    }
  }
  return;
}

Assistant:

void
EefcFlash::eraseAll(uint32_t offset)
{
    // Do a full chip erase if the offset is 0
    if (offset == 0)
    {
        waitFSR();
        writeFCR0(EEFC_FCMD_EA, 0);
        if (_planes == 2)
        {
            waitFSR();
            writeFCR1(EEFC_FCMD_EA, 0);
        }

        // Erase all can take an exceptionally long time on some devices
        // so wait on FSR for up to 30 seconds
        waitFSR(30);
    }
    // Else we must do it by pages
    else
    {
        // Offset must be on an erase page boundary
        if (offset % (_size * PagesPerErase))
            throw FlashEraseError();

        // Erase each PagesPerErase set of pages
        for (uint32_t pageNum = offset / _size; pageNum < _pages; pageNum += PagesPerErase)
        {
            if (_planes == 1 || pageNum < _pages / 2)
            {
                waitFSR();
                writeFCR0(EEFC_FCMD_EPA, pageNum | 0x1);
            }
            else
            {
                waitFSR();
                writeFCR1(EEFC_FCMD_EPA, (pageNum % (_pages / 2)) | 0x1);
            }
        }
    }
}